

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
btTriangleMeshShape::btTriangleMeshShape
          (btTriangleMeshShape *this,btStridingMeshInterface *meshInterface)

{
  int iVar1;
  
  btConcaveShape::btConcaveShape(&this->super_btConcaveShape);
  (this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btTriangleMeshShape_00226e60;
  this->m_meshInterface = meshInterface;
  (this->super_btConcaveShape).super_btCollisionShape.m_shapeType = 0x15;
  iVar1 = (*meshInterface->_vptr_btStridingMeshInterface[10])(meshInterface);
  if ((char)iVar1 == '\0') {
    recalcLocalAabb(this);
  }
  else {
    (*meshInterface->_vptr_btStridingMeshInterface[0xc])
              (meshInterface,&this->m_localAabbMin,&this->m_localAabbMax);
  }
  return;
}

Assistant:

btTriangleMeshShape::btTriangleMeshShape(btStridingMeshInterface* meshInterface)
: btConcaveShape (), m_meshInterface(meshInterface)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	if(meshInterface->hasPremadeAabb())
	{
		meshInterface->getPremadeAabb(&m_localAabbMin, &m_localAabbMax);
	}
	else
	{
		recalcLocalAabb();
	}
}